

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inject_sleigh.cc
# Opt level: O1

void InjectPayloadSleigh::checkParameterRestrictions
               (InjectContextSleigh *con,
               vector<InjectParameter,_std::allocator<InjectParameter>_> *inputlist,
               vector<InjectParameter,_std::allocator<InjectParameter>_> *output,string *source)

{
  pointer pIVar1;
  pointer pIVar2;
  pointer pVVar3;
  uint4 *puVar4;
  LowlevelError *pLVar5;
  long lVar6;
  uint4 *puVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  pIVar1 = (inputlist->super__Vector_base<InjectParameter,_std::allocator<InjectParameter>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (inputlist->super__Vector_base<InjectParameter,_std::allocator<InjectParameter>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar6 = ((long)pIVar2 - (long)pIVar1 >> 3) * -0x3333333333333333;
  pVVar3 = (con->super_InjectContext).inputlist.
           super__Vector_base<VarnodeData,_std::allocator<VarnodeData>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (lVar6 + ((long)(con->super_InjectContext).inputlist.
                     super__Vector_base<VarnodeData,_std::allocator<VarnodeData>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pVVar3 >> 3) * 0x5555555555555555 !=
      0) {
    pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20);
    std::operator+(&bStack_38,
                   "Injection parameter list has different number of parameters than p-code operation: "
                   ,source);
    LowlevelError::LowlevelError(pLVar5,&bStack_38);
    __cxa_throw(pLVar5,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  if (pIVar2 != pIVar1) {
    lVar6 = lVar6 + (ulong)(lVar6 == 0);
    puVar7 = &pVVar3->size;
    puVar4 = &pIVar1->size;
    do {
      if ((*puVar4 != 0) && (*puVar4 != *puVar7)) {
        pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::operator+(&bStack_38,
                       "P-code input parameter size does not match injection specification: ",source
                      );
        LowlevelError::LowlevelError(pLVar5,&bStack_38);
        __cxa_throw(pLVar5,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      puVar7 = puVar7 + 6;
      puVar4 = puVar4 + 10;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  pIVar1 = (output->super__Vector_base<InjectParameter,_std::allocator<InjectParameter>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pIVar2 = (output->super__Vector_base<InjectParameter,_std::allocator<InjectParameter>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar6 = ((long)pIVar2 - (long)pIVar1 >> 3) * -0x3333333333333333;
  pVVar3 = (con->super_InjectContext).output.
           super__Vector_base<VarnodeData,_std::allocator<VarnodeData>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (lVar6 + ((long)(con->super_InjectContext).output.
                     super__Vector_base<VarnodeData,_std::allocator<VarnodeData>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pVVar3 >> 3) * 0x5555555555555555 !=
      0) {
    pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20);
    std::operator+(&bStack_38,"Injection output does not match output of p-code operation: ",source)
    ;
    LowlevelError::LowlevelError(pLVar5,&bStack_38);
    __cxa_throw(pLVar5,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  if (pIVar2 != pIVar1) {
    lVar6 = lVar6 + (ulong)(lVar6 == 0);
    puVar4 = &pVVar3->size;
    puVar7 = &pIVar1->size;
    do {
      if ((*puVar7 != 0) && (*puVar7 != *puVar4)) {
        pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::operator+(&bStack_38,"P-code output size does not match injection specification: ",
                       source);
        LowlevelError::LowlevelError(pLVar5,&bStack_38);
        __cxa_throw(pLVar5,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      puVar4 = puVar4 + 6;
      puVar7 = puVar7 + 10;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  return;
}

Assistant:

void InjectPayloadSleigh::checkParameterRestrictions(InjectContextSleigh &con,
						     const vector<InjectParameter> &inputlist,
						     const vector<InjectParameter> &output,
						     const string &source)
{ // Verify that the storage locations passed in -con- match the restrictions set for this payload
  if (inputlist.size() != con.inputlist.size())
    throw LowlevelError("Injection parameter list has different number of parameters than p-code operation: "+source);
  for(int4 i=0;i<inputlist.size();++i) {
    uint4 sz = inputlist[i].getSize();
    if ((sz != 0) && (sz != con.inputlist[i].size))
      throw LowlevelError("P-code input parameter size does not match injection specification: "+source);
  }
  if (output.size() != con.output.size())
    throw LowlevelError("Injection output does not match output of p-code operation: "+source);
  for(int4 i=0;i<output.size();++i) {
    uint4 sz = output[i].getSize();
    if ((sz != 0) && (sz != con.output[i].size))
      throw LowlevelError("P-code output size does not match injection specification: "+source);
  }
}